

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

Time __thiscall helics::TimeCoordinator::generateAllowedTime(TimeCoordinator *this,Time testTime)

{
  bool bVar1;
  baseType in_RSI;
  TimeRepresentation<count_time<9,_long>_> in_RDI;
  double __x;
  double blk;
  Time timeBase;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffff88;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffff98;
  TimeRepresentation<count_time<9,_long>_> local_30;
  baseType local_28;
  TimeRepresentation<count_time<9,_long>_> local_20 [2];
  TimeRepresentation<count_time<9,_long>_> local_10 [2];
  
  local_10[0].internalTimeCode = in_RSI;
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                    ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI.internalTimeCode + 0x248),
                     (TimeRepresentation<count_time<9,_long>_> *)&timeEpsilon);
  if (bVar1) {
    local_20[0] = TimeRepresentation<count_time<9,_long>_>::maxVal();
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==(local_10,local_20);
    if (bVar1) {
      return (Time)local_10[0].internalTimeCode;
    }
    local_28 = ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI.internalTimeCode + 0x178))->
               internalTimeCode;
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI.internalTimeCode + 0x178)
                       ,(TimeRepresentation<count_time<9,_long>_> *)
                        (in_RDI.internalTimeCode + 0x240));
    if (bVar1) {
      local_28 = ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI.internalTimeCode + 0x240))->
                 internalTimeCode;
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=
                        (local_10,(TimeRepresentation<count_time<9,_long>_> *)
                                  (in_RDI.internalTimeCode + 0x240));
      if (bVar1) {
        return (Time)((TimeRepresentation<count_time<9,_long>_> *)(in_RDI.internalTimeCode + 0x240))
                     ->internalTimeCode;
      }
    }
    local_30 = TimeRepresentation<count_time<9,_long>_>::operator-
                         (in_stack_ffffffffffffff98.internalTimeCode,in_RDI.internalTimeCode);
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                      (&local_30,
                       (TimeRepresentation<count_time<9,_long>_> *)(in_RDI.internalTimeCode + 0x248)
                      );
    if (bVar1) {
      TimeRepresentation<count_time<9,_long>_>::operator-
                ((TimeRepresentation<count_time<9,_long>_> *)
                 in_stack_ffffffffffffff98.internalTimeCode,
                 (TimeRepresentation<count_time<9,_long>_> *)in_RDI.internalTimeCode);
      __x = operator/(in_RDI,in_stack_ffffffffffffff88);
      ceil(__x);
      ::operator*((double)in_stack_ffffffffffffff88.internalTimeCode,in_RDI);
      local_10[0] = ::operator+(in_stack_ffffffffffffff98,in_RDI.internalTimeCode);
    }
    else {
      local_10[0] = TimeRepresentation<count_time<9,_long>_>::operator+
                              (in_stack_ffffffffffffff98.internalTimeCode,in_RDI.internalTimeCode);
    }
  }
  return (Time)local_10[0].internalTimeCode;
}

Assistant:

Time TimeCoordinator::generateAllowedTime(Time testTime) const
{
    if (info.period > timeEpsilon) {
        if (testTime == Time::maxVal()) {
            return testTime;
        }
        auto timeBase = time_grantBase;
        if (time_grantBase < info.offset) {
            timeBase = info.offset;
            if (testTime <= info.offset) {
                return info.offset;
            }
        }
        if (testTime - timeBase > info.period) {
            auto blk = std::ceil((testTime - timeBase) / info.period);
            testTime = timeBase + blk * info.period;
        } else {
            testTime = timeBase + info.period;
        }
    }
    return testTime;
}